

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

void intermediate_representation(Context_conflict *ctx)

{
  int index;
  int index_00;
  int iVar1;
  size_t len;
  MOJOSHADER_irStatement **ppMVar2;
  MOJOSHADER_irStatement *pMVar3;
  MOJOSHADER_irStatement *pMVar4;
  MOJOSHADER_irStatement *funcseq;
  int end;
  int start;
  size_t arraylen;
  MOJOSHADER_astCompilationUnitFunction *astfn;
  MOJOSHADER_astCompilationUnit *ast;
  Context_conflict *ctx_local;
  
  len = (long)(ctx->user_func_index + 1) << 3;
  ppMVar2 = (MOJOSHADER_irStatement **)Malloc(ctx,len);
  ctx->ir = ppMVar2;
  if (ctx->ir != (MOJOSHADER_irStatement **)0x0) {
    memset(ctx->ir,0,len);
    ctx->ir_end = -1;
    ctx->ir_ret = -1;
    for (astfn = (MOJOSHADER_astCompilationUnitFunction *)ctx->ast;
        astfn != (MOJOSHADER_astCompilationUnitFunction *)0x0;
        astfn = (MOJOSHADER_astCompilationUnitFunction *)astfn->next) {
      if ((astfn->ast).type < MOJOSHADER_AST_COMPUNIT_FUNCTION) {
        __assert_fail("ast->ast.type > MOJOSHADER_AST_COMPUNIT_START_RANGE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x172d,"void intermediate_representation(Context *)");
      }
      if (MOJOSHADER_AST_COMPUNIT_VARIABLE < (astfn->ast).type) {
        __assert_fail("ast->ast.type < MOJOSHADER_AST_COMPUNIT_END_RANGE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x172e,"void intermediate_representation(Context *)");
      }
      if (((astfn->ast).type == MOJOSHADER_AST_COMPUNIT_FUNCTION) &&
         (astfn->definition != (MOJOSHADER_astStatement *)0x0)) {
        if (ctx->ir_loop != (LoopLabels *)0x0) {
          __assert_fail("ctx->ir_loop == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1736,"void intermediate_representation(Context *)");
        }
        if (-1 < ctx->ir_end) {
          __assert_fail("ctx->ir_end < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1737,"void intermediate_representation(Context *)");
        }
        if (-1 < ctx->ir_ret) {
          __assert_fail("ctx->ir_ret < 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1738,"void intermediate_representation(Context *)");
        }
        index = generate_ir_label(ctx);
        index_00 = generate_ir_label(ctx);
        ctx->ir_end = index_00;
        if (astfn->declaration->datatype != (MOJOSHADER_astDataType *)0x0) {
          iVar1 = generate_ir_temp(ctx);
          ctx->ir_ret = iVar1;
        }
        pMVar3 = new_ir_label(ctx,index);
        pMVar4 = build_ir_stmt(ctx,astfn->definition);
        pMVar3 = new_ir_seq(ctx,pMVar3,pMVar4);
        pMVar4 = new_ir_label(ctx,index_00);
        pMVar3 = new_ir_seq(ctx,pMVar3,pMVar4);
        if (ctx->ir_loop != (LoopLabels *)0x0) {
          __assert_fail("ctx->ir_loop == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1742,"void intermediate_representation(Context *)");
        }
        ctx->ir_end = -1;
        ctx->ir_ret = -1;
        if (ctx->user_func_index < astfn->index) {
          __assert_fail("astfn->index <= ctx->user_func_index",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1746,"void intermediate_representation(Context *)");
        }
        if (ctx->ir[astfn->index] != (MOJOSHADER_irStatement *)0x0) {
          __assert_fail("ctx->ir[astfn->index] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                        ,0x1747,"void intermediate_representation(Context *)");
        }
        ctx->ir[astfn->index] = pMVar3;
      }
    }
    print_whole_ir(ctx,_stdout);
    delete_compilation_unit(ctx,&ctx->ast->compunit);
    ctx->ast = (MOJOSHADER_astNode *)0x0;
  }
  return;
}

Assistant:

static void intermediate_representation(Context *ctx)
{
    const MOJOSHADER_astCompilationUnit *ast = NULL;
    const MOJOSHADER_astCompilationUnitFunction *astfn = NULL;
    const size_t arraylen = (ctx->user_func_index+1) * sizeof (MOJOSHADER_irStatement *);

    ctx->ir = Malloc(ctx, arraylen);
    if (ctx->ir == NULL)
        return;
    memset(ctx->ir, '\0', arraylen);

    ctx->ir_end = -1;
    ctx->ir_ret = -1;

    for (ast = &ctx->ast->compunit; ast != NULL; ast = ast->next)
    {
        assert(ast->ast.type > MOJOSHADER_AST_COMPUNIT_START_RANGE);
        assert(ast->ast.type < MOJOSHADER_AST_COMPUNIT_END_RANGE);
        if (ast->ast.type != MOJOSHADER_AST_COMPUNIT_FUNCTION)
            continue;  // only care about functions right now.

        astfn = (MOJOSHADER_astCompilationUnitFunction *) ast;
        if (astfn->definition == NULL)  // just a predeclare; skip.
            continue;

        assert(ctx->ir_loop == NULL);  // parser should have caught this!
        assert(ctx->ir_end < 0);  // parser should have caught this!
        assert(ctx->ir_ret < 0);  // parser should have caught this!
        const int start = generate_ir_label(ctx);  // !!! FIXME: store somewhere.
        const int end = generate_ir_label(ctx);
        ctx->ir_end = end;

        if (astfn->declaration->datatype != NULL)
            ctx->ir_ret = generate_ir_temp(ctx);

        MOJOSHADER_irStatement *funcseq = new_ir_seq(ctx, new_ir_label(ctx, start), build_ir_stmt(ctx, astfn->definition));
        funcseq = new_ir_seq(ctx, funcseq, new_ir_label(ctx, end));
        assert(ctx->ir_loop == NULL);  // parser should have caught this!
        ctx->ir_end = -1;
        ctx->ir_ret = -1;

        assert(astfn->index <= ctx->user_func_index);
        assert(ctx->ir[astfn->index] == NULL);
        ctx->ir[astfn->index] = funcseq;
    } // for

    print_whole_ir(ctx, stdout);

    // done with the AST, nuke it.
    // !!! FIXME: we're going to need CTAB data from this at some point.
    delete_compilation_unit(ctx, (MOJOSHADER_astCompilationUnit *) ctx->ast);
    ctx->ast = NULL;
}